

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
createMacro(Parser *parser,string *text,int flags,
           initializer_list<AssemblyTemplateArgument> variables)

{
  MipsMacroCommand *this;
  undefined4 in_register_00000014;
  pointer *__ptr;
  initializer_list<AssemblyTemplateArgument> variables_00;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> content;
  CAssemblerCommand *local_28;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_20;
  
  variables_00._M_array._4_4_ = in_register_00000014;
  variables_00._M_array._0_4_ = flags;
  variables_00._M_len = variables._M_len;
  Parser::parseTemplate((Parser *)&stack0xffffffffffffffd8,text,variables_00);
  this = (MipsMacroCommand *)operator_new(0x28);
  local_20._M_head_impl = local_28;
  local_28 = (CAssemblerCommand *)0x0;
  MipsMacroCommand::MipsMacroCommand
            (this,(unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                  &stack0xffffffffffffffe0,(int)variables._M_array);
  if (local_20._M_head_impl != (CAssemblerCommand *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  if (local_28 != (CAssemblerCommand *)0x0) {
    (*(code *)(((pointer)local_28)->tokenizer->tokens).
              super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.super__List_node_base.
              _M_prev)();
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> createMacro(Parser& parser, const std::string& text, int flags, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::unique_ptr<CAssemblerCommand> content = parser.parseTemplate(text,variables);
	return std::make_unique<MipsMacroCommand>(std::move(content),flags);
}